

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

bool __thiscall llvm::DWARFDebugNames::ValueIterator::getEntryAtCurrentOffset(ValueIterator *this)

{
  undefined1 auVar1 [8];
  undefined1 uVar2;
  undefined1 local_e8 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  anon_class_1_0_00000001 local_19;
  
  NameIndex::getEntry((Expected<llvm::DWARFDebugNames::Entry> *)local_e8,this->CurrentIndex,
                      &this->DataOffset);
  uVar2 = EntryOr.field_0.TStorage.buffer[0xb0];
  auVar1 = local_e8;
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::operator=
              (&(this->CurrentEntry).Storage,(Entry *)local_e8);
  }
  else {
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    EntryOr._184_8_ = (ulong)auVar1 | 1;
    handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
              ((Error *)&EntryOr.field_0xb8,&local_19);
    if ((long *)(EntryOr._184_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(EntryOr._184_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    local_e8 = (undefined1  [8])&PTR___cxa_pure_virtual_01097f30;
    if (EntryOr.field_0.ErrorStorage.buffer !=
        (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
         )((long)&EntryOr.field_0 + 0x10)) {
      free((void *)EntryOr.field_0.ErrorStorage.buffer);
    }
  }
  else if ((char  [8])local_e8 != (char  [8])0x0) {
    (**(code **)(*(long *)local_e8 + 8))();
  }
  return (bool)(~uVar2 & 1);
}

Assistant:

bool DWARFDebugNames::ValueIterator::getEntryAtCurrentOffset() {
  auto EntryOr = CurrentIndex->getEntry(&DataOffset);
  if (!EntryOr) {
    consumeError(EntryOr.takeError());
    return false;
  }
  CurrentEntry = std::move(*EntryOr);
  return true;
}